

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::getChrm(float *m,float *whitepoint,uint use_icc,LodePNGICC *icc,LodePNGInfo *info)

{
  undefined4 in_EAX;
  uint uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar23;
  float fVar24;
  undefined1 auVar22 [16];
  float fVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  float local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  double local_28;
  
  local_38._8_8_ = local_38._0_8_;
  if (use_icc == 0) {
    if ((info->chrm_defined == 0) || (info->srgb_defined != 0)) {
      m[4] = 0.7151522;
      m[5] = 0.072175;
      m[6] = 0.0193339;
      m[7] = 0.119192;
      m[0] = 0.4124564;
      m[1] = 0.3575761;
      m[2] = 0.1804375;
      m[3] = 0.2126729;
      m[8] = 0.9503041;
      whitepoint[0] = 0.9504559;
      whitepoint[1] = 1.0;
      whitepoint[2] = 1.0890578;
    }
    else {
      auVar22._0_4_ =
           ((float)(info->chrm_white_y >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(info->chrm_white_y & 0xffff | 0x4b000000);
      auVar22._4_4_ =
           ((float)(info->chrm_red_y >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(info->chrm_red_y & 0xffff | 0x4b000000);
      auVar22._8_4_ =
           ((float)(info->chrm_green_y >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(info->chrm_green_y & 0xffff | 0x4b000000);
      auVar22._12_4_ =
           ((float)(info->chrm_blue_y >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(info->chrm_blue_y & 0xffff | 0x4b000000);
      local_38 = divps(auVar22,_DAT_0012ca20);
      fVar19 = local_38._0_4_;
      fVar23 = local_38._4_4_;
      fVar24 = local_38._8_4_;
      fVar25 = local_38._12_4_;
      auVar6._4_4_ = -(uint)(fVar23 == 0.0);
      auVar6._0_4_ = -(uint)(fVar19 == 0.0);
      auVar6._8_4_ = -(uint)(fVar24 == 0.0);
      auVar6._12_4_ = -(uint)(fVar25 == 0.0);
      iVar2 = movmskps(in_EAX,auVar6);
      if (iVar2 != 0) {
        return 1;
      }
      fVar9 = (float)info->chrm_white_x / 100000.0;
      fVar13 = (float)info->chrm_blue_x / 100000.0;
      fVar15 = (float)info->chrm_green_x / 100000.0;
      fVar11 = (float)info->chrm_red_x / 100000.0;
      local_48 = CONCAT44(local_48._4_4_,fVar9);
      uVar1 = getChrmMatrixXYZ(m,fVar9 / fVar19,1.0,((1.0 - fVar9) - fVar19) / fVar19,
                               fVar11 / fVar23,1.0,((1.0 - fVar11) - fVar23) / fVar23,
                               fVar15 / fVar24,1.0,((1.0 - fVar15) - fVar24) / fVar24,
                               fVar13 / fVar25,1.0,((1.0 - fVar13) - fVar25) / fVar25);
      if (uVar1 != 0) {
        return 1;
      }
      *whitepoint = (float)local_48 / (float)local_38._0_4_;
      whitepoint[1] = 1.0;
      whitepoint[2] = ((1.0 - fVar9) - (float)local_38._0_4_) / (float)local_38._0_4_;
    }
  }
  else if (icc->inputspace == 2) {
    uStack_70 = 0;
    uStack_60 = 0;
    local_78 = 0x3f800000;
    local_68 = 0x3f800000;
    local_58 = 1.0;
    uVar1 = icc->has_chad;
    if (uVar1 == 0) {
      getAdaptationMatrix((float *)&local_78,(int)whitepoint,icc->illuminant[0],icc->illuminant[1],
                          icc->illuminant[2],icc->white[0],icc->white[1],icc->white[2]);
    }
    else {
      local_58 = icc->chad[8];
      local_78 = *(undefined8 *)icc->chad;
      uStack_70 = *(undefined8 *)(icc->chad + 2);
      local_68 = *(undefined8 *)(icc->chad + 4);
      uStack_60 = *(undefined8 *)(icc->chad + 6);
      invMatrix((float *)&local_78);
    }
    fVar19 = icc->white[1];
    if (uVar1 == 0) {
      local_7c = icc->white[2];
      local_48 = CONCAT44(fVar19,icc->white[0]);
    }
    else {
      fVar23 = icc->white[0];
      fVar24 = icc->white[2];
      local_48 = CONCAT44(fVar24 * local_68._4_4_ +
                          fVar23 * uStack_70._4_4_ + fVar19 * (float)local_68,
                          fVar24 * (float)uStack_70 +
                          fVar23 * (float)local_78 + fVar19 * local_78._4_4_);
      local_7c = local_58 * fVar24 + (float)uStack_60 * fVar23 + uStack_60._4_4_ * fVar19;
    }
    uStack_40 = 0;
    dVar28 = (double)icc->red[0];
    dVar20 = (double)icc->red[1];
    dVar27 = (double)icc->red[2];
    dVar12 = (double)(float)local_78;
    dVar16 = (double)local_78._4_4_;
    dVar10 = (double)(float)uStack_70;
    dVar14 = (double)uStack_70._4_4_;
    local_28 = dVar27 * dVar10 + dVar28 * dVar12 + dVar20 * dVar16;
    dVar17 = (double)(float)local_68;
    dVar18 = (double)local_68._4_4_;
    local_38._0_8_ = (undefined8)(float)uStack_60;
    dVar26 = (double)uStack_60._4_4_;
    dVar21 = (double)local_58;
    dVar3 = (double)icc->green[0];
    dVar7 = (double)icc->green[1];
    dVar29 = (double)icc->green[2];
    dVar8 = (double)icc->blue[1];
    dVar30 = (double)icc->blue[0];
    dVar4 = (double)icc->blue[2];
    uVar1 = getChrmMatrixXYZ(m,(float)local_48,local_48._4_4_,local_7c,(float)local_28,
                             (float)(dVar27 * dVar18 + dVar28 * dVar14 + dVar20 * dVar17),
                             (float)(dVar27 * dVar21 +
                                    dVar28 * (double)local_38._0_8_ + dVar20 * dVar26),
                             (float)(dVar29 * dVar10 + dVar3 * dVar12 + dVar16 * dVar7),
                             (float)(dVar29 * dVar18 + dVar3 * dVar14 + dVar17 * dVar7),
                             (float)(dVar29 * dVar21 +
                                    dVar3 * (double)local_38._0_8_ + dVar7 * dVar26),
                             (float)(dVar10 * dVar4 + dVar12 * dVar30 + dVar16 * dVar8),
                             (float)(dVar18 * dVar4 + dVar14 * dVar30 + dVar17 * dVar8),
                             (float)(dVar4 * dVar21 +
                                    dVar30 * (double)local_38._0_8_ + dVar26 * dVar8));
    if (uVar1 != 0) {
      return 1;
    }
    *(undefined8 *)whitepoint = local_48;
    whitepoint[2] = local_7c;
  }
  else {
    m[8] = 1.0;
    auVar5._0_12_ = ZEXT812(0x3f800000);
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(m + 4) = auVar5;
    *(undefined1 (*) [16])m = auVar5;
    whitepoint[2] = 1.0;
    whitepoint[0] = 1.0;
    whitepoint[1] = 1.0;
  }
  return 0;
}

Assistant:

static unsigned getChrm(float m[9], float whitepoint[3], unsigned use_icc,
                        const LodePNGICC* icc, const LodePNGInfo* info) {
  size_t i;
  if(use_icc) {
    if(getICCChrm(m, whitepoint, icc)) return 1;  /* error in the matrix computations */
  } else if(info->chrm_defined && !info->srgb_defined) {
    float wx = info->chrm_white_x / 100000.0f, wy = info->chrm_white_y / 100000.0f;
    float rx = info->chrm_red_x / 100000.0f, ry = info->chrm_red_y / 100000.0f;
    float gx = info->chrm_green_x / 100000.0f, gy = info->chrm_green_y / 100000.0f;
    float bx = info->chrm_blue_x / 100000.0f, by = info->chrm_blue_y / 100000.0f;
    if(getChrmMatrixXY(m, wx, wy, rx, ry, gx, gy, bx, by)) return 1; /* returns if error */
    /* Output whitepoint, xyY to XYZ: */
    whitepoint[0] = wx / wy;
    whitepoint[1] = 1;
    whitepoint[2] = (1 - wx - wy) / wy;
  } else {
    /* the standard linear sRGB to XYZ matrix */
    static const float srgb[9] = {
        0.4124564f, 0.3575761f, 0.1804375f,
        0.2126729f, 0.7151522f, 0.0721750f,
        0.0193339f, 0.1191920f, 0.9503041f
    };
    for(i = 0; i < 9; i++) m[i] = srgb[i];
    /* sRGB's whitepoint xyY "0.3127,0.3290,1" in XYZ: */
    whitepoint[0] = 0.9504559270516716f;
    whitepoint[1] = 1;
    whitepoint[2] = 1.0890577507598784f;
  }
  return 0;
}